

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender __thiscall
fmt::v8::detail::write_int_noinline<char,fmt::v8::appender,unsigned_long>
          (detail *this,appender out,write_int_arg<unsigned_long> arg,
          basic_format_specs<char> *specs,locale_ref loc)

{
  presentation_type pVar1;
  size_t sVar2;
  int iVar3;
  char *digits;
  appender aVar4;
  long lVar5;
  byte *pbVar6;
  ulong uVar7;
  char *pcVar8;
  uint uVar9;
  basic_format_specs<char> *specs_00;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar10;
  char *pcVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  appender it;
  bool bVar19;
  format_decimal_result<char_*> fVar20;
  undefined1 local_88 [8];
  char buffer [20];
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_38;
  
  specs_00 = arg._8_8_;
  pVar1 = specs_00->type;
  uVar14 = (uint)arg.abs_value;
  unique0x10000690 = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  local_38.container = (buffer<char> *)this;
  switch(pVar1) {
  case none:
  case dec:
    break;
  case oct:
    uVar15 = 0;
    iVar3 = 0;
    bVar10 = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
    do {
      iVar3 = iVar3 + 1;
      uVar15 = uVar15 - 1;
      bVar19 = (buffer<char> *)0x7 < bVar10.container;
      bVar10.container = bVar10.container >> 3;
    } while (bVar19);
    if (((char)*(ushort *)&specs_00->field_0x9 < '\0') &&
       (out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container !=
        (buffer<char> *)0x0 && specs_00->precision <= iVar3)) {
      uVar13 = 0x3000;
      if (uVar14 == 0) {
        uVar13 = 0x30;
      }
      uVar14 = (uVar13 | uVar14) + 0x1000000;
    }
    uVar13 = specs_00->width;
    iVar16 = specs_00->precision;
    if (iVar16 == -1 && uVar13 == 0) {
      if ((uVar14 != 0) && (uVar13 = uVar14 & 0xffffff, (uVar14 & 0xffffff) != 0)) {
        do {
          if (*(ulong *)(this + 0x18) < *(long *)(this + 0x10) + 1U) {
            (*(code *)**(undefined8 **)this)(this);
          }
          lVar17 = *(long *)(this + 0x10);
          *(long *)(this + 0x10) = lVar17 + 1;
          *(char *)(*(long *)(this + 8) + lVar17) = (char)uVar13;
          bVar19 = 0xff < uVar13;
          uVar13 = uVar13 >> 8;
        } while (bVar19);
      }
      lVar17 = *(long *)(this + 0x10);
      uVar7 = lVar17 - uVar15;
      if (*(ulong *)(this + 0x18) < uVar7) {
        lVar17 = 0;
      }
      else {
        *(ulong *)(this + 0x10) = uVar7;
        lVar17 = lVar17 + *(long *)(this + 8);
      }
      if (lVar17 != 0) {
        pbVar6 = (byte *)(~uVar15 + lVar17);
        do {
          *pbVar6 = SUB81(out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,0
                         ) & 7 | 0x30;
          pbVar6 = pbVar6 + -1;
          bVar19 = (buffer<char> *)0x7 <
                   (ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
          out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
               (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
               (buffer<char> *)
               ((ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container >> 3
               );
        } while (bVar19);
        return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)this;
      }
      pbVar6 = local_88 + ~uVar15;
      pcVar8 = local_88 + -uVar15;
      do {
        *pbVar6 = SUB81(out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,0)
                  & 7 | 0x30;
        pbVar6 = pbVar6 + -1;
        bVar19 = (buffer<char> *)0x7 <
                 (ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
        out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
             (buffer<char> *)
             ((ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container >> 3);
      } while (bVar19);
      goto LAB_0019ed6a;
    }
    uVar9 = (uVar14 >> 0x18) + iVar3;
    buffer._0_8_ = ZEXT48(uVar9);
    if ((*(ushort *)&specs_00->field_0x9 & 0xf) == 4) {
      if (uVar9 < uVar13) {
        buffer._8_8_ = (ulong)uVar13 - buffer._0_8_;
        buffer._0_8_ = (ulong)uVar13;
        goto LAB_0019ec62;
      }
    }
    else {
      buffer._8_8_ = ZEXT48((uint)(iVar16 - iVar3));
      if (iVar16 - iVar3 != 0 && iVar3 <= iVar16) {
        buffer._0_8_ = ZEXT48(iVar16 + (uVar14 >> 0x18));
        goto LAB_0019ec62;
      }
    }
    buffer._8_8_ = 0;
LAB_0019ec62:
    local_88._0_4_ = uVar14;
    aVar4 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_)::_lambda(fmt::v8::appender)_1_&>
                      ((appender)this,specs_00,buffer._0_8_,buffer._0_8_,
                       (anon_class_40_3_03e05ccd *)local_88);
    return (appender)
           aVar4.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  case hex_lower:
  case hex_upper:
    if ((char)*(ushort *)&specs_00->field_0x9 < '\0') {
      uVar9 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
      uVar13 = uVar9 << 8;
      if (uVar14 == 0) {
        uVar13 = uVar9;
      }
      uVar14 = (uVar13 | uVar14) + 0x2000000;
    }
    bVar10 = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
    lVar17 = 0;
    do {
      lVar18 = lVar17;
      lVar17 = lVar18 + 1;
      bVar19 = (buffer<char> *)0xf < bVar10.container;
      bVar10.container = bVar10.container >> 4;
    } while (bVar19);
    uVar13 = specs_00->width;
    iVar3 = specs_00->precision;
    if (iVar3 == -1 && uVar13 == 0) {
      if ((uVar14 != 0) && (uVar13 = uVar14 & 0xffffff, (uVar14 & 0xffffff) != 0)) {
        do {
          if (*(ulong *)(this + 0x18) < *(long *)(this + 0x10) + 1U) {
            (*(code *)**(undefined8 **)this)(this);
          }
          lVar5 = *(long *)(this + 0x10);
          *(long *)(this + 0x10) = lVar5 + 1;
          *(char *)(*(long *)(this + 8) + lVar5) = (char)uVar13;
          bVar19 = 0xff < uVar13;
          uVar13 = uVar13 >> 8;
        } while (bVar19);
      }
      lVar5 = *(long *)(this + 0x10);
      uVar15 = lVar5 + lVar17;
      if (*(ulong *)(this + 0x18) < uVar15) {
        lVar5 = 0;
      }
      else {
        *(ulong *)(this + 0x10) = uVar15;
        lVar5 = lVar5 + *(long *)(this + 8);
      }
      if (lVar5 != 0) {
        pcVar8 = "0123456789abcdef";
        if (pVar1 == hex_upper) {
          pcVar8 = "0123456789ABCDEF";
        }
        pcVar11 = (char *)(lVar5 + lVar17);
        do {
          pcVar11 = pcVar11 + -1;
          *pcVar11 = pcVar8[SUB84(out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                  container,0) & 0xf];
          bVar19 = (buffer<char> *)0xf <
                   (ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
          out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
               (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
               (buffer<char> *)
               ((ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container >> 4
               );
        } while (bVar19);
        return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)this;
      }
      pcVar11 = local_88 + lVar18;
      pcVar8 = local_88 + lVar18 + 1;
      pcVar12 = "0123456789abcdef";
      if (pVar1 == hex_upper) {
        pcVar12 = "0123456789ABCDEF";
      }
      do {
        *pcVar11 = pcVar12[SUB84(out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                 container,0) & 0xf];
        pcVar11 = pcVar11 + -1;
        bVar19 = (buffer<char> *)0xf <
                 (ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
        out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
             (buffer<char> *)
             ((ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container >> 4);
      } while (bVar19);
      goto LAB_0019ed6a;
    }
    uVar9 = uVar14 >> 0x18;
    buffer._0_8_ = (ulong)uVar9 + lVar17;
    if ((*(ushort *)&specs_00->field_0x9 & 0xf) == 4) {
      if ((uint)buffer._0_8_ < uVar13) {
        buffer._8_8_ = ((ulong)uVar13 - (ulong)uVar9) - lVar17;
        buffer._0_8_ = (ulong)uVar13;
        goto LAB_0019ea93;
      }
    }
    else if ((int)lVar17 < iVar3) {
      buffer._0_8_ = ZEXT48(uVar9 + iVar3);
      buffer._8_8_ = ZEXT48((uint)(iVar3 - (int)lVar17));
      goto LAB_0019ea93;
    }
    buffer._8_8_ = 0;
LAB_0019ea93:
    local_88._0_4_ = uVar14;
    aVar4 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_)::_lambda(fmt::v8::appender)_1_&>
                      ((appender)this,specs_00,buffer._0_8_,buffer._0_8_,
                       (anon_class_40_3_03e05ccd_conflict *)local_88);
    return (appender)
           aVar4.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  case bin_lower:
  case bin_upper:
    if ((char)*(ushort *)&specs_00->field_0x9 < '\0') {
      uVar9 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
      uVar13 = uVar9 << 8;
      if (uVar14 == 0) {
        uVar13 = uVar9;
      }
      uVar14 = (uVar13 | uVar14) + 0x2000000;
    }
    bVar10 = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
    lVar17 = 0;
    do {
      lVar18 = lVar17;
      lVar17 = lVar18 + 1;
      bVar19 = (buffer<char> *)0x1 < bVar10.container;
      bVar10.container = bVar10.container >> 1;
    } while (bVar19);
    uVar13 = specs_00->width;
    iVar3 = specs_00->precision;
    if (iVar3 == -1 && uVar13 == 0) {
      if ((uVar14 != 0) && (uVar13 = uVar14 & 0xffffff, (uVar14 & 0xffffff) != 0)) {
        do {
          if (*(ulong *)(this + 0x18) < *(long *)(this + 0x10) + 1U) {
            (*(code *)**(undefined8 **)this)(this);
          }
          lVar5 = *(long *)(this + 0x10);
          *(long *)(this + 0x10) = lVar5 + 1;
          *(char *)(*(long *)(this + 8) + lVar5) = (char)uVar13;
          bVar19 = 0xff < uVar13;
          uVar13 = uVar13 >> 8;
        } while (bVar19);
      }
      lVar5 = *(long *)(this + 0x10);
      uVar15 = lVar5 + lVar17;
      if (*(ulong *)(this + 0x18) < uVar15) {
        lVar5 = 0;
      }
      else {
        *(ulong *)(this + 0x10) = uVar15;
        lVar5 = lVar5 + *(long *)(this + 8);
      }
      if (lVar5 != 0) {
        pbVar6 = (byte *)(lVar5 + lVar17);
        do {
          pbVar6 = pbVar6 + -1;
          *pbVar6 = SUB81(out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,0
                         ) & 1 | 0x30;
          bVar19 = (buffer<char> *)0x1 <
                   (ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
          out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
               (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
               (buffer<char> *)
               ((ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container >> 1
               );
        } while (bVar19);
        return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)this;
      }
      pbVar6 = local_88 + lVar18;
      pcVar8 = local_88 + lVar18 + 1;
      do {
        *pbVar6 = SUB81(out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,0)
                  & 1 | 0x30;
        pbVar6 = pbVar6 + -1;
        bVar19 = (buffer<char> *)0x1 <
                 (ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
        out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
             (buffer<char> *)
             ((ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container >> 1);
      } while (bVar19);
      goto LAB_0019ed6a;
    }
    uVar9 = uVar14 >> 0x18;
    buffer._0_8_ = (ulong)uVar9 + lVar17;
    if ((*(ushort *)&specs_00->field_0x9 & 0xf) == 4) {
      if ((uint)buffer._0_8_ < uVar13) {
        buffer._8_8_ = ((ulong)uVar13 - (ulong)uVar9) - lVar17;
        buffer._0_8_ = (ulong)uVar13;
        goto LAB_0019ea57;
      }
    }
    else if ((int)lVar17 < iVar3) {
      buffer._0_8_ = ZEXT48(uVar9 + iVar3);
      buffer._8_8_ = ZEXT48((uint)(iVar3 - (int)lVar17));
      goto LAB_0019ea57;
    }
    buffer._8_8_ = 0;
LAB_0019ea57:
    local_88._0_4_ = uVar14;
    aVar4 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_)::_lambda(fmt::v8::appender)_1_&>
                      ((appender)this,specs_00,buffer._0_8_,buffer._0_8_,
                       (anon_class_40_3_03e05ccd *)local_88);
    return (appender)
           aVar4.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  default:
    throw_format_error("invalid type specifier");
  case chr:
    local_88[0] = (char)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
    aVar4 = write_padded<(fmt::v8::align::type)1,fmt::v8::appender,char,fmt::v8::detail::write_char<char,fmt::v8::appender>(fmt::v8::appender,char,fmt::v8::basic_format_specs<char>const&)::_lambda(fmt::v8::appender)_1_&>
                      ((appender)this,specs_00,1,1,(anon_class_1_1_a8c68091 *)local_88);
    return (appender)
           aVar4.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  }
  if (((specs_00->field_0xa & 1) != 0) &&
     (bVar19 = write_int_localized<fmt::v8::appender,unsigned_long,char>
                         ((appender *)&local_38,
                          (unsigned_long)
                          out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                          uVar14,specs_00,(locale_ref)specs), bVar19)) {
    return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)local_38.container;
  }
  this = (detail *)local_38.container;
  lVar17 = 0x3f;
  if (((ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container | 1) != 0) {
    for (; ((ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container | 1) >>
           lVar17 == 0; lVar17 = lVar17 + -1) {
    }
  }
  iVar16 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar17] -
           (uint)((ulong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container <
                 *(buffer<char> **)
                  (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                  (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar17] * 8));
  uVar13 = specs_00->width;
  iVar3 = specs_00->precision;
  if (iVar3 == -1 && uVar13 == 0) {
    if ((uVar14 != 0) &&
       (uVar14 = uVar14 & 0xffffff,
       ((undefined1  [16])arg & (undefined1  [16])0xffffff) != (undefined1  [16])0x0)) {
      do {
        if (((buffer<char> *)this)->capacity_ < ((buffer<char> *)this)->size_ + 1) {
          (**((buffer<char> *)this)->_vptr_buffer)(this);
        }
        sVar2 = ((buffer<char> *)this)->size_;
        ((buffer<char> *)this)->size_ = sVar2 + 1;
        ((buffer<char> *)this)->ptr_[sVar2] = (char)uVar14;
        bVar19 = 0xff < uVar14;
        uVar14 = uVar14 >> 8;
      } while (bVar19);
    }
    fVar20 = format_decimal<char,unsigned_long>
                       (local_88,(unsigned_long)
                                 out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                                 container,iVar16);
    pcVar8 = fVar20.end;
LAB_0019ed6a:
    aVar4 = copy_str_noinline<char,char*,fmt::v8::appender>(local_88,pcVar8,(appender)this);
    return (appender)
           aVar4.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  }
  uVar9 = (uVar14 >> 0x18) + iVar16;
  buffer._0_8_ = ZEXT48(uVar9);
  if ((*(ushort *)&specs_00->field_0x9 & 0xf) == 4) {
    if (uVar9 < uVar13) {
      buffer._8_8_ = (ulong)uVar13 - buffer._0_8_;
      buffer._0_8_ = (ulong)uVar13;
      goto LAB_0019eb3b;
    }
  }
  else {
    buffer._8_8_ = ZEXT48((uint)(iVar3 - iVar16));
    if (iVar3 - iVar16 != 0 && iVar16 <= iVar3) {
      buffer._0_8_ = ZEXT48(iVar3 + (uVar14 >> 0x18));
      goto LAB_0019eb3b;
    }
  }
  buffer._8_8_ = 0;
LAB_0019eb3b:
  local_88._0_4_ = uVar14;
  aVar4 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_)::_lambda(fmt::v8::appender)_1_&>
                    ((appender)local_38.container,specs_00,buffer._0_8_,buffer._0_8_,
                     (anon_class_40_3_03e05ccd *)local_88);
  return (appender)
         aVar4.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}